

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusTexGenMode::emulate_mthd(MthdCelsiusTexGenMode *this)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar3 != 0) {
    if (uVar3 == 0x855f) {
      if (2 < this->which) goto LAB_001e2c3d;
      uVar3 = 6;
    }
    else if (uVar3 == 0x2401) {
      uVar3 = 2;
    }
    else if (uVar3 == 0x2402) {
      if (1 < this->which) goto LAB_001e2c3d;
      uVar3 = 3;
    }
    else if (uVar3 == 0x8511) {
      if (2 < this->which) goto LAB_001e2c3d;
      uVar3 = 4;
    }
    else if (uVar3 == 0x8512) {
      if (2 < this->which) goto LAB_001e2c3d;
      uVar3 = 5;
    }
    else {
      if (uVar3 != 0x2400) {
LAB_001e2c3d:
        MthdTest::warn((MthdTest *)this,uVar4 | 1);
        return;
      }
      uVar3 = 1;
    }
  }
  if (uVar4 == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      lVar1 = (ulong)(this->which != 3) * 4 + 3;
      bVar2 = (char)this->which * '\x03' +
              (char)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 *
              '\x0e' + 3;
      uVar3 = ((uint)lVar1 & uVar3) << (bVar2 & 0x3f) |
              ~(uint)(lVar1 << (bVar2 & 0x3f)) &
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar3;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) ==
          0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar3
        ;
      }
    }
    return;
  }
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify;
  if ((uVar3 & 0x70000000) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify = uVar3 | uVar4 << 0x1c;
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 0;
				break;
			case 0x2400:
				rv = 1;
				break;
			case 0x2401:
				rv = 2;
				break;
			case 0x8511:
				if (which < 3) {
					rv = 4;
					break;
				}
			case 0x8512:
				if (which < 3) {
					rv = 5;
					break;
				}
			case 0x855f:
				if (which < 3) {
					rv = 6;
					break;
				}
			case 0x2402:
				if (which < 2) {
					rv = 3;
					break;
				}
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_b, 3 + idx * 14 + which * 3, which == 3 ? 2 : 3, rv);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}